

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_io.cc
# Opt level: O2

int __thiscall comp_io_buf::open_file(comp_io_buf *this,char *name,bool stdin_off,int flag)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  int ret;
  int local_14;
  value_type local_10;
  
  local_14 = -1;
  if (flag == 2) {
    pcVar2 = "wb";
  }
  else {
    if (flag != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Unknown file operation. Something other than READ/WRITE specified");
      std::endl<char,std::char_traits<char>>(poVar3);
      return local_14;
    }
    if (*name == '\0') {
      if (stdin_off) {
        return -1;
      }
      iVar1 = fileno(_stdin);
      local_10 = (value_type)gzdopen(iVar1,"rb");
      goto LAB_001d6c03;
    }
    pcVar2 = "rb";
  }
  local_10 = (value_type)gzopen64(name,pcVar2);
LAB_001d6c03:
  if (local_10 != (value_type)0x0) {
    std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::push_back(&this->gz_files,&local_10);
    local_14 = (int)((ulong)(*(long *)&this->field_0xb0 - *(long *)&this->gz_files) >> 3) + -1;
    v_array<int>::push_back(&(this->super_io_buf).files,&local_14);
  }
  return local_14;
}

Assistant:

int comp_io_buf::open_file(const char* name, bool stdin_off, int flag)
{
  gzFile fil = nullptr;
  int ret = -1;
  switch (flag)
  {
    case READ:
      if (*name != '\0')
        fil = gzopen(name, "rb");
      else if (!stdin_off)
#ifdef _WIN32
        fil = gzdopen(_fileno(stdin), "rb");
#else
        fil = gzdopen(fileno(stdin), "rb");
#endif
      if (fil != nullptr)
      {
        gz_files.push_back(fil);
        ret = (int)gz_files.size() - 1;
        files.push_back(ret);
      }
      break;

    case WRITE:
      fil = gzopen(name, "wb");
      if (fil != nullptr)
      {
        gz_files.push_back(fil);
        ret = (int)gz_files.size() - 1;
        files.push_back(ret);
      }
      break;

    default:
      std::cerr << "Unknown file operation. Something other than READ/WRITE specified" << std::endl;
  }
  return ret;
}